

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-IRIS-Training.cpp
# Opt level: O2

double comparePrediction(MatrixXd *prediction,MatrixXd *label)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long startRow;
  void *local_c0 [3];
  void *local_a8 [3];
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_> local_90 [48];
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>_> local_60 [48];
  
  iVar4 = 0;
  for (startRow = 0;
      lVar1 = (prediction->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows, startRow < lVar1; startRow = startRow + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)local_60,prediction,
               startRow,0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a8,local_60);
    iVar2 = matrixMax((MatrixXd *)local_a8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *)local_90,label,
               startRow,0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,3,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_c0,local_90);
    iVar3 = matrixMax((MatrixXd *)local_c0);
    free(local_c0[0]);
    free(local_a8[0]);
    iVar4 = iVar4 + (uint)(iVar2 == iVar3);
  }
  return (double)iVar4 / (double)lVar1;
}

Assistant:

double comparePrediction(Eigen::MatrixXd prediction, Eigen::MatrixXd label) {
    int correctPredictions = 0;
    int wrongPredictions = 0;
    for(int i = 0; i < prediction.rows(); i++) {
        if(matrixMax(prediction.block<1,3>(i,0)) == matrixMax(label.block<1,3>(i,0))) {
            correctPredictions++;
        }
        else {
            wrongPredictions++;
        }
    }
    return (double)correctPredictions / prediction.rows();
}